

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O2

bool cc::sendMessage(Connection *conn,string *ns,string *message)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  buffer;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  contents;
  allocator<char> local_121;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_120;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_100;
  undefined1 local_e0 [48];
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  uint32_t local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
  local_38;
  
  if (s_verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Sending to \'");
    poVar4 = std::operator<<(poVar4,(string *)dest_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"\': \'");
    poVar4 = std::operator<<(poVar4,(string *)ns);
    poVar4 = std::operator<<(poVar4,": \'");
    poVar4 = std::operator<<(poVar4,(string *)message);
    poVar4 = std::operator<<(poVar4,"\'");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_e0._16_8_ = local_e0 + 0x20;
  local_e0._8_8_ = 0;
  local_e0._0_8_ = &PTR__CastMessage_00127a30;
  local_e0._24_8_ = 0;
  local_e0[0x20] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_68._M_p = (pointer)&local_58;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_70 = 0;
  std::__cxx11::string::_M_assign((string *)&local_90);
  std::__cxx11::string::assign(local_e0 + 0x10);
  if (dest_abi_cxx11_._8_8_ == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"receiver-0",&local_121)
    ;
  }
  else {
    std::__cxx11::string::string((string *)&local_120,(string *)dest_abi_cxx11_);
  }
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::_M_assign((string *)&local_68);
  uVar3 = (**(code **)(local_e0._0_8_ + 0x18))();
  local_120.field_2._M_allocated_capacity._0_4_ =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 4;
  local_120.field_2._M_local_buf[4] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  reserve(&local_100,0x400);
  local_e0._8_8_ = local_e0._8_8_ & 0xffffffff00000000;
  cVar1 = (**(code **)(local_e0._0_8_ + 0x20))(local_e0,&local_120);
  if (cVar1 == '\0') {
    puts("Failed to serialize");
    bVar2 = false;
  }
  else {
    bVar2 = Connection::write<unsigned_char>(conn,&local_120);
  }
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&local_100);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&local_120);
  CastMessage::~CastMessage((CastMessage *)local_e0);
  return bVar2;
}

Assistant:

bool sendMessage(const Connection &conn, const std::string &ns, const std::string &message)
{
    if (s_verbose) {
        std::cout << "Sending to '" << dest << "': '" << ns << ": '" << message << "'" << std::endl;
    }

    CastMessage msg;
    msg._payload_type = CastMessage::STRING;
    msg._protocol_version = CastMessage::CASTV2_1_0;
    msg._namespace = ns;
    msg._source_id = "sender-0";
    msg._destination_id = dest.empty() ? "receiver-0" : dest;
    msg._payload_utf8 = message;

    const uint32_t byteSize = htonl(uint32_t(msg.size()));
    std::basic_string<uint8_t> buffer(sizeof byteSize, '\0');
    memcpy(buffer.data(), &byteSize, sizeof byteSize);

    std::basic_string<uint8_t> contents;
    contents.reserve(1024);
    if (!msg.serialize(&buffer)) {
        puts("Failed to serialize");
        return false;
    }
    return conn.write(buffer);
}